

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  RGBColorSpace *cs;
  array<float,_4> aVar1;
  anon_class_24_3_48d30edf func;
  float fVar2;
  undefined8 uVar7;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar13;
  SampledSpectrum SVar14;
  RGB RVar15;
  initializer_list<float> __l;
  SampledSpectrum local_c8;
  RGBSpectrum *local_b8;
  Point2f *pPStack_b0;
  Tuple2<pbrt::Vector2,_float> **local_a8;
  Point2f st;
  Tuple2<pbrt::Vector2,_float> local_80;
  Tuple2<pbrt::Vector2,_float> local_78;
  Tuple2<pbrt::Vector2,_float> *local_70;
  RGBSpectrum local_68;
  float fStack_40;
  Float FStack_3c;
  Float FStack_38;
  Float FStack_34;
  Float FStack_30;
  int iStack_2c;
  undefined1 extraout_var [56];
  undefined1 auVar8 [56];
  undefined1 auVar9 [16];
  undefined1 auVar12 [56];
  
  if ((this->super_ImageTextureBase).mipmap == (MIPMap *)0x0) {
    auVar3._0_4_ = (this->super_ImageTextureBase).scale;
  }
  else {
    st.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)&local_78;
    local_70 = &local_80;
    pPStack_b0 = &st;
    local_a8 = &local_70;
    local_b8 = &local_68;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_80.x = 0.0;
    local_80.y = 0.0;
    local_68.rgb.r = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_68.rgb.g = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_68.rgb.b = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_68.scale = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68.rsp.c0 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.rsp.c1 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_68.rsp.c2 = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68._28_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.illuminant = (DenselySampledSpectrum *)ctx._32_8_;
    fStack_40 = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    FStack_3c = ctx.dudx;
    FStack_38 = ctx.dudy;
    FStack_34 = ctx.dvdx;
    FStack_30 = ctx.dvdy;
    iStack_2c = ctx.faceIndex;
    func.dstdx = (Vector2f **)pPStack_b0;
    func.ctx = (TextureEvalContext *)local_b8;
    func.dstdy = (Vector2f **)local_a8;
    auVar4._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   ::
                   Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                               *)this,func);
    auVar4._8_56_ = extraout_var;
    uVar7 = vmovlps_avx(auVar4._0_16_);
    auVar3 = vmovshdup_avx(auVar4._0_16_);
    st.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar7;
    st.super_Tuple2<pbrt::Point2,_float>.y = 1.0 - auVar3._0_4_;
    uVar7 = 0;
    fVar2 = (this->super_ImageTextureBase).scale;
    RVar15 = MIPMap::Lookup<pbrt::RGB>
                       ((this->super_ImageTextureBase).mipmap,&st,(Vector2f)local_78,
                        (Vector2f)local_80);
    auVar3._0_4_ = fVar2 * RVar15.r;
    auVar3._4_4_ = fVar2 * RVar15.g;
    auVar3._8_4_ = fVar2 * (float)uVar7;
    auVar3._12_4_ = fVar2 * (float)((ulong)uVar7 >> 0x20);
    fVar2 = fVar2 * RVar15.b;
    auVar12 = (undefined1  [56])0x0;
    local_b8 = (RGBSpectrum *)vmovlps_avx(auVar3);
    pPStack_b0 = (Point2f *)CONCAT44(pPStack_b0._4_4_,fVar2);
    cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
    if (cs != (RGBColorSpace *)0x0) {
      local_68.rgb._0_8_ = vmovlps_avx(auVar3);
      local_68.rgb.b = fVar2;
      __l._M_len = 3;
      __l._M_array = (iterator)&local_68;
      fVar2 = std::max<float>(__l);
      if (fVar2 <= 1.0) {
        auVar8 = extraout_var_00;
        RGBReflectanceSpectrum::RGBReflectanceSpectrum
                  ((RGBReflectanceSpectrum *)&local_68,cs,(RGB *)&local_b8);
        SVar14 = RGBReflectanceSpectrum::Sample((RGBReflectanceSpectrum *)&local_68,&lambda);
        auVar11._0_8_ = SVar14.values.values._8_8_;
        auVar11._8_56_ = auVar12;
        auVar9 = auVar11._0_16_;
        auVar6._0_8_ = SVar14.values.values._0_8_;
        auVar6._8_56_ = auVar8;
        auVar3 = auVar6._0_16_;
      }
      else {
        auVar8 = extraout_var_00;
        RGBSpectrum::RGBSpectrum(&local_68,cs,(RGB *)&local_b8);
        SVar14 = RGBSpectrum::Sample(&local_68,&lambda);
        auVar10._0_8_ = SVar14.values.values._8_8_;
        auVar10._8_56_ = auVar12;
        auVar9 = auVar10._0_16_;
        auVar5._0_8_ = SVar14.values.values._0_8_;
        auVar5._8_56_ = auVar8;
        auVar3 = auVar5._0_16_;
      }
      aVar1.values = (float  [4])vmovlhps_avx(auVar3,auVar9);
      return (SampledSpectrum)(array<float,_4>)aVar1.values;
    }
    auVar9 = vmovshdup_avx(auVar3);
    fVar13 = auVar9._0_4_;
    if (((auVar3._0_4_ != fVar13) || (fVar13 != fVar2)) || (NAN(fVar13) || NAN(fVar2))) {
      LogFatal<char_const(&)[37]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0x1ba,"Check failed: %s",(char (*) [37])"rgb[0] == rgb[1] && rgb[1] == rgb[2]");
    }
  }
  SampledSpectrum::SampledSpectrum(&local_c8,auVar3._0_4_);
  return (array<float,_4>)(array<float,_4>)local_c8;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    if (!mipmap)
        return SampledSpectrum(scale);
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    // Texture coordinates are (0,0) in the lower left corner, but
    // image coordinates are (0,0) in the upper left.
    st[1] = 1 - st[1];
    RGB rgb = scale * mipmap->Lookup<RGB>(st, dstdx, dstdy);
    const RGBColorSpace *cs = mipmap->GetRGBColorSpace();
    if (cs != nullptr) {
        if (std::max({rgb.r, rgb.g, rgb.b}) > 1)
            return RGBSpectrum(*cs, rgb).Sample(lambda);
        return RGBReflectanceSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    CHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);
#endif
}